

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_TextRange_resizeT(ImVector_TextRange *self,int new_size,TextRange v)

{
  int new_size_local;
  ImVector_TextRange *self_local;
  TextRange v_local;
  
  v_local.b = v.e;
  self_local = (ImVector_TextRange *)v.b;
  ImVector<ImGuiTextFilter::ImGuiTextRange>::resize(self,new_size,(ImGuiTextRange *)&self_local);
  return;
}

Assistant:

CIMGUI_API void ImVector_TextRange_resizeT(ImVector_TextRange* self,int new_size,const TextRange v)
{
    return self->resize(new_size,v);
}